

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O1

Vec_Str_t * Ioa_WriteEncodeLiterals(Vec_Int_t *vLits)

{
  bool bVar1;
  int iVar2;
  Vec_Str_t *pVVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  
  iVar11 = vLits->nSize;
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar11 * 2 - 1U) {
    iVar10 = iVar11 * 2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)malloc((long)iVar10);
  }
  pVVar3->pArray = pcVar4;
  if (iVar11 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar5 = *vLits->pArray;
  lVar6 = 0;
  uVar8 = uVar5;
  if (0x7f < uVar5) {
    lVar6 = 0;
    uVar7 = uVar5;
    do {
      pcVar4[lVar6] = (byte)uVar7 | 0x80;
      lVar6 = lVar6 + 1;
      uVar8 = uVar7 >> 7;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar1);
  }
  pcVar4[(int)lVar6] = (char)uVar8;
  iVar11 = (int)lVar6 + 1;
  if (1 < vLits->nSize) {
    pcVar4 = pVVar3->pArray;
    iVar10 = pVVar3->nCap;
    lVar6 = 1;
    do {
      uVar8 = vLits->pArray[lVar6];
      iVar2 = uVar8 - uVar5;
      if ((int)uVar8 < (int)uVar5) {
        iVar2 = -(uVar8 - uVar5);
      }
      uVar5 = (uint)((int)uVar8 < (int)uVar5) + iVar2 * 2;
      if (0x7f < (uint)(iVar2 * 2)) {
        pbVar9 = (byte *)(pcVar4 + iVar11);
        uVar7 = uVar5;
        do {
          *pbVar9 = (byte)uVar7 | 0x80;
          uVar5 = uVar7 >> 7;
          pbVar9 = pbVar9 + 1;
          iVar11 = iVar11 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar5;
        } while (bVar1);
      }
      pcVar4[iVar11] = (char)uVar5;
      if (iVar10 < iVar11 + 0xb) {
        iVar10 = iVar10 + 1;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)malloc((long)iVar10);
        }
        else {
          pcVar4 = (char *)realloc(pcVar4,(long)iVar10);
        }
      }
      lVar6 = lVar6 + 1;
      iVar11 = iVar11 + 1;
      uVar5 = uVar8;
    } while (lVar6 < vLits->nSize);
    pVVar3->pArray = pcVar4;
    pVVar3->nCap = iVar10;
  }
  pVVar3->nSize = iVar11;
  return pVVar3;
}

Assistant:

Vec_Str_t * Ioa_WriteEncodeLiterals( Vec_Int_t * vLits )
{
    Vec_Str_t * vBinary;
    int Pos = 0, Lit, LitPrev, Diff, i;
    vBinary = Vec_StrAlloc( 2 * Vec_IntSize(vLits) );
    LitPrev = Vec_IntEntry( vLits, 0 );
    Pos = Ioa_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, LitPrev ); 
    Vec_IntForEachEntryStart( vLits, Lit, i, 1 )
    {
        Diff = Lit - LitPrev;
        Diff = (Lit < LitPrev)? -Diff : Diff;
        Diff = (Diff << 1) | (int)(Lit < LitPrev);
        Pos = Ioa_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, Diff );
        LitPrev = Lit;
        if ( Pos + 10 > vBinary->nCap )
            Vec_StrGrow( vBinary, vBinary->nCap+1 );
    }
    vBinary->nSize = Pos;
/*
    // verify
    {
        extern Vec_Int_t * Ioa_WriteDecodeLiterals( char ** ppPos, int nEntries );
        char * pPos = Vec_StrArray( vBinary );
        Vec_Int_t * vTemp = Ioa_WriteDecodeLiterals( &pPos, Vec_IntSize(vLits) );
        for ( i = 0; i < Vec_IntSize(vLits); i++ )
        {
            int Entry1 = Vec_IntEntry(vLits,i);
            int Entry2 = Vec_IntEntry(vTemp,i);
            assert( Entry1 == Entry2 );
        }
        Vec_IntFree( vTemp );
    }
*/
    return vBinary;
}